

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O2

symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_symmetric_difference_iterator<std::initializer_list<int>const,std::initializer_list<int>const,std::greater<void>>
          (symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this)

{
  _Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  local_70;
  iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_58;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_28 = *(undefined4 *)this;
  uStack_24 = *(undefined4 *)(this + 4);
  uStack_20 = *(undefined4 *)(this + 8);
  uStack_1c = *(undefined4 *)(this + 0xc);
  detail::
  apply_impl<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>const&,std::initializer_list<int>const&>&,0ul,1ul>
            (&local_70,(detail *)&make_range_vector);
  own_as_range_t::operator()
            ((iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
              *)&local_58,(own_as_range_t *)&own_as_range,
             (vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
              *)&local_70);
  make_symmetric_difference_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>,std::greater<void>>
            (__return_storage_ptr__,(burst *)&local_58);
  boost::iterator_range_detail::
  iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base(&local_58);
  std::
  _Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  ::~_Vector_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

auto make_symmetric_difference_iterator (std::tuple<Ranges &...> ranges, Compare compare)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_symmetric_difference_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges)),
                std::move(compare)
            );
    }